

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O2

void __thiscall CodeEmitter::emitterError(CodeEmitter *this,string *errorMessage)

{
  ostream *poVar1;
  CodeEmitterError *this_00;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_190,"Code emitter error: ");
  std::operator<<(poVar1,(string *)errorMessage);
  this_00 = (CodeEmitterError *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  CodeEmitterError::CodeEmitterError(this_00,&local_1c0);
  __cxa_throw(this_00,&CodeEmitterError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CodeEmitter::emitterError(std::string errorMessage) {
    std::stringstream ss;
    ss << "Code emitter error: " << errorMessage;
    throw CodeEmitterError{ ss.str() };
}